

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.hpp
# Opt level: O1

void __thiscall
jsoncons::
key_value<std::__cxx11::string,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
::key_value<std::__cxx11::string&>
          (key_value<std::__cxx11::string,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
           *this,key_type *name,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  allocator<char> local_19;
  
  *(key_value<std::__cxx11::string,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
    **)this = this + 0x10;
  pcVar2 = (name->_M_dataplus)._M_p;
  paVar1 = &name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar1) {
    uVar3 = *(undefined8 *)((long)&name->field_2 + 8);
    *(size_type *)(this + 0x10) = paVar1->_M_allocated_capacity;
    *(undefined8 *)(this + 0x18) = uVar3;
  }
  else {
    *(pointer *)this = pcVar2;
    *(size_type *)(this + 0x10) = paVar1->_M_allocated_capacity;
  }
  *(size_type *)(this + 8) = name->_M_string_length;
  (name->_M_dataplus)._M_p = (pointer)paVar1;
  name->_M_string_length = 0;
  (name->field_2)._M_local_buf[0] = '\0';
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::basic_json
            ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
             (this + 0x20),(args->_M_dataplus)._M_p,args->_M_string_length,none,&local_19);
  return;
}

Assistant:

key_value(key_type&& name,  Args&& ... args) 
            : key_(std::move(name)), value_(std::forward<Args>(args)...)
        {
        }